

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

uint __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetMarkCountOnHeapBlockMap
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  char *pcVar1;
  Recycler *pRVar2;
  ushort uVar3;
  char *page;
  char *address;
  uint uVar4;
  
  address = (this->super_HeapBlock).address;
  pcVar1 = address + 0x8000;
  uVar4 = 0;
  if (address < pcVar1) {
    pRVar2 = this->heapBucket->heapInfo->recycler;
    uVar4 = 0;
    do {
      uVar3 = HeapBlockMap64::GetPageMarkCount(&pRVar2->heapBlockMap,address);
      uVar4 = uVar4 + uVar3;
      address = address + 0x1000;
    } while (address < pcVar1);
  }
  return uVar4;
}

Assistant:

uint
SmallHeapBlockT<TBlockAttributes>::GetMarkCountOnHeapBlockMap() const
{
    uint heapBlockMapMarkCount = 0;
    char* startPage = this->GetAddress();
    char* endPage = this->GetEndAddress();
    const HeapBlockMap& blockMap = this->GetRecycler()->heapBlockMap;
    for (char* page = startPage; page < endPage; page += AutoSystemInfo::PageSize)
    {
        heapBlockMapMarkCount += blockMap.GetPageMarkCount(page);
    }
    return heapBlockMapMarkCount;
}